

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultConverters.cpp
# Opt level: O0

void genericCU8toCF32(void *srcBuff,void *dstBuff,size_t numElems,double scaler)

{
  long in_RDX;
  long in_RSI;
  float fVar1;
  double in_XMM0_Qa;
  size_t i;
  float *dst;
  uint8_t *src;
  size_t elemDepth;
  undefined8 local_40;
  
  for (local_40 = 0; local_40 < (ulong)(in_RDX << 1); local_40 = local_40 + 1) {
    fVar1 = SoapySDR::U8toF32('\0');
    *(float *)(in_RSI + local_40 * 4) = (float)((double)fVar1 * in_XMM0_Qa);
  }
  return;
}

Assistant:

static void genericCU8toCF32(const void *srcBuff, void *dstBuff, const size_t numElems, const double scaler)
{
  const size_t elemDepth = 2;

  auto *src = (uint8_t*)srcBuff;
  auto *dst = (float*)dstBuff;
  for (size_t i = 0; i < numElems*elemDepth; i++)
    {
      dst[i] = SoapySDR::U8toF32(src[i]) * scaler;
    }
}